

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

ExecutionResult __thiscall nigel::Preprocessor::onExecute(Preprocessor *this,CodeBase *base)

{
  pointer pLVar1;
  pointer pLVar2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *plVar5;
  ExecutionResult EVar6;
  bool ignoreifdef;
  allocator local_101;
  size_t ifdefCount;
  size_t posAtIgnore;
  key_type local_f0;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_c0;
  __shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> local_b0;
  string local_a0;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  definitions;
  
  definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &definitions._M_t._M_impl.super__Rb_tree_header._M_header;
  definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  definitions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ifdefCount = 0;
  ignoreifdef = false;
  posAtIgnore = 0;
  definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_f0,"__PLATFORM__",(allocator *)&local_a0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&definitions,&local_f0);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::to_string(&local_a0,1.2);
  std::operator+(&local_f0,"NIGEL_",&local_a0);
  std::__cxx11::string::string((string *)&local_80,"__COMPILER__",&local_101);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&definitions,&local_80);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,(__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)base);
  processFile(this,base,(shared_ptr<boost::filesystem::path> *)&local_b0,&base->fileCont,
              &definitions,&ifdefCount,&ignoreifdef,&posAtIgnore);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  if (ifdefCount != 0) {
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_c0,
                   (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)((base->fileCont).
                       super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1));
    pLVar1 = (base->fileCont).
             super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar2 = (base->fileCont).
             super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,(__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)base);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_unclosedIfdef,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_c0,((long)pLVar1 - (long)pLVar2) / 0x28,
               (shared_ptr<boost::filesystem::path> *)&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  }
  plVar5 = &(this->super_BuilderExecutable).notificationList;
  EVar6 = imParsingFailed;
  p_Var4 = (_List_node_base *)plVar5;
  do {
    p_Var4 = (((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar5) {
      EVar6 = success;
      break;
    }
  } while (0x7ffd < *(int *)p_Var4[1]._M_next - 1U);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&definitions._M_t);
  return EVar6;
}

Assistant:

ExecutionResult Preprocessor::onExecute( CodeBase & base )
	{
		std::map<String, String> definitions;
		size_t ifdefCount = 0;
		bool ignoreifdef = false;
		size_t posAtIgnore = 0;

		//Default definitions
		definitions["__PLATFORM__"] = "ATMEL_8051";
		definitions["__COMPILER__"] = "NIGEL_" + to_string( NIGEL_VERSION );

		processFile( base, base.srcFile, base.fileCont, definitions, ifdefCount, ignoreifdef, posAtIgnore );

		if( ifdefCount > 0 )
			generateNotification( NT::err_unclosedIfdef, base.fileCont.back().content, base.fileCont.size(), base.srcFile );

		bool hasError = false;
		for( auto &n : notificationList ) if( n->type > NT::begin_err && n->type < NT::begin_warning )
		{
			hasError = true;
			break;
		}

		if( hasError ) return ExecutionResult::imParsingFailed;
		else return ExecutionResult::success;
	}